

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcObjTemplate * __thiscall
CTcParser::find_template_match
          (CTcParser *this,CTcObjTemplate *first_tpl,CTcObjTemplateInst *src,size_t src_cnt)

{
  int iVar1;
  CTcObjTemplate *in_RSI;
  size_t in_RDI;
  CTcObjTemplateItem *unaff_retaddr;
  CTcObjTemplate *tpl;
  CTcObjTemplate *local_30;
  CTcObjTemplateInst *in_stack_fffffffffffffff8;
  
  local_30 = in_RSI;
  while( true ) {
    if (local_30 == (CTcObjTemplate *)0x0) {
      return (CTcObjTemplate *)0x0;
    }
    iVar1 = match_template((CTcParser *)tpl,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
    if (iVar1 != 0) break;
    local_30 = *(CTcObjTemplate **)(local_30 + 0x10);
  }
  return local_30;
}

Assistant:

const CTcObjTemplate *CTcParser::
   find_template_match(const CTcObjTemplate *first_tpl,
                       CTcObjTemplateInst *src, size_t src_cnt)
{

    /* find the matching template */
    for (const CTcObjTemplate *tpl = first_tpl ; tpl != 0 ; tpl = tpl->nxt_)
    {
        /* check for a match */
        if (match_template(tpl->items_, src, src_cnt))
        {
            /* it's a match - return this template */
            return tpl;
        }
    }

    /* we didn't find a match */
    return 0;
}